

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)

{
  long lVar1;
  long lVar2;
  undefined8 in_RDI;
  gost_mgm_ctx *mctx;
  gost_grasshopper_cipher_ctx *in_stack_ffffffffffffffe0;
  long lVar3;
  undefined4 local_4;
  
  lVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if (lVar1 == 0) {
    local_4 = 0;
  }
  else {
    gost_grasshopper_cipher_destroy(in_stack_ffffffffffffffe0);
    OPENSSL_cleanse((void *)(lVar1 + 0x1090),200);
    lVar3 = *(long *)(lVar1 + 0x1158);
    lVar2 = EVP_CIPHER_CTX_iv_noconst(in_RDI);
    if (lVar3 != lVar2) {
      CRYPTO_free(*(void **)(lVar1 + 0x1158));
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    if (mctx == NULL)
        return 0;
    gost_grasshopper_cipher_destroy(&mctx->ks.gh_ks);
    OPENSSL_cleanse(&mctx->mgm, sizeof(mctx->mgm));
    if (mctx->iv != EVP_CIPHER_CTX_iv_noconst(c))
        OPENSSL_free(mctx->iv);
    return 1;
}